

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char8_t * fmt::v5::internal::
          parse_format_specs<fmt::v5::char8_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&>
                    (char8_t *begin,char8_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                    *handler)

{
  uint_least8_t *puVar1;
  char8_t cVar2;
  char8_t cVar3;
  byte bVar4;
  type tVar5;
  basic_format_specs<fmt::v5::char8_t> *pbVar6;
  bool bVar7;
  bool bVar8;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
  *psVar9;
  ulong uVar10;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
  *psVar11;
  uint uVar12;
  char *message;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
  *this;
  alignment aVar13;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
  *psVar14;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
  *local_40;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
  local_38;
  
  if (begin == end) {
    return begin;
  }
  cVar2 = *begin;
  if (cVar2 == 0x7d) {
    return begin;
  }
  psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
             *)(begin + 1);
  uVar10 = (ulong)(psVar11 !=
                  (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                   *)end);
  do {
    cVar3 = begin[uVar10];
    bVar8 = false;
    bVar7 = true;
    if (cVar3 < 0x3e) {
      if (cVar3 == 0x3c) {
        aVar13 = ALIGN_LEFT;
        goto LAB_00215b85;
      }
      aVar13 = ALIGN_DEFAULT;
      if (cVar3 == 0x3d) {
        aVar13 = ALIGN_NUMERIC;
        bVar8 = true;
        bVar7 = false;
      }
    }
    else {
      if (cVar3 == 0x3e) {
        aVar13 = ALIGN_RIGHT;
      }
      else {
        aVar13 = ALIGN_DEFAULT;
        if (cVar3 != 0x5e) goto LAB_00215b89;
        aVar13 = ALIGN_CENTER;
      }
LAB_00215b85:
      bVar7 = false;
      bVar8 = false;
    }
LAB_00215b89:
    if (!bVar7) {
      local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                  *)begin;
      if (0 < (long)uVar10) {
        if (cVar2 == 0x7b) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                     ).context_,"invalid fill character \'{\'");
          psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                     *)begin;
        }
        else {
          psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                     *)(begin + 2);
          (((handler->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
            ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).fill_ = (uint)cVar2;
        }
        if ((uint)cVar2 == L'{') break;
      }
      if ((bVar8) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
        ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).align_ = aVar13;
      begin = (char8_t *)psVar11;
      break;
    }
    bVar7 = 0 < (long)uVar10;
    uVar10 = uVar10 - 1;
  } while (bVar7);
  if (begin == end) {
    return (char8_t *)
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
            *)begin;
  }
  bVar4 = *(byte *)&(((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                       *)begin)->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                    ).super_specs_setter<fmt::v5::char8_t>.specs_;
  local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
              *)begin;
  if (bVar4 == 0x20) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    tVar5 = handler->arg_type_;
    if ((tVar5 - named_arg_type < 7) &&
       ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00215d39:
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                          ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
  }
  else {
    if (bVar4 == 0x2d) {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar5 = handler->arg_type_;
      if ((tVar5 - named_arg_type < 7) &&
         ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                  ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00215d39;
    }
    if (bVar4 == 0x2b) {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar5 = handler->arg_type_;
      if ((tVar5 - named_arg_type < 7) &&
         ((char_type < tVar5 || ((0x94U >> (tVar5 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                  ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00215d39;
    }
  }
  if (local_40 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
       *)end) {
    return (char8_t *)local_40;
  }
  if (*(byte *)&(local_40->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_ == 0x23) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 8;
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                          ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
    if (local_40 ==
        (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
         *)end) {
      return (char8_t *)local_40;
    }
  }
  if (*(byte *)&(local_40->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_ == 0x30) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar6 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
             ).super_specs_setter<fmt::v5::char8_t>.specs_;
    (pbVar6->super_align_spec).fill_ = L'0';
    (pbVar6->super_align_spec).align_ = ALIGN_NUMERIC;
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                          ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
    if (local_40 ==
        (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
         *)end) {
      return (char8_t *)local_40;
    }
  }
  bVar4 = *(byte *)&(local_40->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                    ).super_specs_setter<fmt::v5::char8_t>.specs_;
  if ((byte)(bVar4 - 0x30) < 10) {
    psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
               *)((long)&(local_40->
                         super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                         ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
    uVar12 = 0;
    psVar14 = psVar11;
    if (bVar4 != 0x30) {
      while (uVar12 < 0xccccccd) {
        uVar12 = ((uint)(byte)psVar14[-1].field_0x17 + uVar12 * 10) - 0x30;
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                   *)end;
        if ((psVar14 ==
             (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
              *)end) ||
           (psVar9 = &psVar14->
                      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
           , psVar11 = psVar14,
           psVar14 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                      *)((long)&(psVar14->
                                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                                ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1),
           9 < (byte)(*(byte *)&(psVar9->super_specs_setter<fmt::v5::char8_t>).specs_ - 0x30)))
        goto LAB_00215e87;
      }
      uVar12 = 0x80000000;
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                 *)&psVar14[-1].field_0x17;
LAB_00215e87:
      if ((int)uVar12 < 0) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_align_spec).width_ = uVar12;
  }
  else {
    psVar11 = local_40;
    if (bVar4 == 0x7b) {
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                 *)((long)&(local_40->
                           super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                           ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
      if (psVar11 !=
          (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
           *)end) {
        local_38.handler = handler;
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                   *)parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                               ((char8_t *)psVar11,end,&local_38);
      }
      if ((psVar11 ==
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
            *)end) ||
         (*(byte *)&(psVar11->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                    ).super_specs_setter<fmt::v5::char8_t>.specs_ != 0x7d)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                   ).context_,"invalid format string");
      }
      else {
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                   *)((long)&(psVar11->
                             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                             ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
      }
    }
  }
  if (psVar11 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
       *)end) {
    return (char8_t *)psVar11;
  }
  local_40 = psVar11;
  if (*(byte *)&(psVar11->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                ).super_specs_setter<fmt::v5::char8_t>.specs_ != 0x2e) goto LAB_00215f98;
  local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
              *)((long)&(psVar11->
                        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                        ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
  if (local_40 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
       *)end) {
    uVar12 = 0;
  }
  else {
    uVar12 = (uint)*(byte *)&(local_40->
                             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                             ).super_specs_setter<fmt::v5::char8_t>.specs_;
  }
  if (uVar12 - 0x30 < 10) {
    uVar12 = parse_nonnegative_int<fmt::v5::char8_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&>
                       ((char8_t **)&local_40,end,handler);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).precision = uVar12;
LAB_00215ef7:
    bVar7 = true;
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                 ).context_,"precision not allowed for this argument type");
      psVar11 = handler;
    }
  }
  else {
    if (uVar12 == 0x7b) {
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                 *)((long)&(psVar11->
                           super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                           ).super_specs_setter<fmt::v5::char8_t>.specs_ + 2);
      local_40 = psVar11;
      if (psVar11 !=
          (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
           *)end) {
        local_38.handler = handler;
        local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                    *)parse_arg_id<fmt::v5::char8_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>,fmt::v5::char8_t>>>&,fmt::v5::char8_t>>
                                ((char8_t *)psVar11,end,
                                 (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>_&,_fmt::v5::char8_t>
                                  *)&local_38);
      }
      if ((local_40 !=
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
            *)end) &&
         (psVar14 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                     *)((long)&(local_40->
                               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                               ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1),
         psVar9 = &local_40->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
         , local_40 = psVar14,
         *(byte *)&(psVar9->super_specs_setter<fmt::v5::char8_t>).specs_ == 0x7d))
      goto LAB_00215ef7;
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
             ).context_;
      message = "invalid format string";
    }
    else {
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
             ).context_;
      message = "missing precision specifier";
    }
    error_handler::on_error((error_handler *)this,message);
    bVar7 = false;
    psVar11 = local_40;
  }
  if (!bVar7) {
    return (char8_t *)psVar11;
  }
LAB_00215f98:
  if ((local_40 !=
       (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
        *)end) &&
     (bVar4 = *(byte *)&(local_40->
                        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                        ).super_specs_setter<fmt::v5::char8_t>.specs_, bVar4 != 0x7d)) {
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
                          ).super_specs_setter<fmt::v5::char8_t>.specs_ + 1);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
      ).super_specs_setter<fmt::v5::char8_t>.specs_)->super_core_format_specs).type = bVar4;
  }
  return (char8_t *)local_40;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}